

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O2

bool M_Responder(event_t *ev)

{
  BYTE BVar1;
  BYTE BVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  FName *menu;
  int iVar7;
  uint uVar8;
  bool bVar9;
  FName local_30;
  FName local_2c;
  
  if (chatmodeon != 0) {
    return false;
  }
  if (menuactive == MENU_Off || DMenu::CurrentMenu == (DMenu *)0x0) {
    if (!MenuEnabled) {
      return false;
    }
    if (ev->type == '\x04') {
      if (ev->subtype != '\a') {
        return false;
      }
      if (ConsoleState == c_down) {
        return false;
      }
      if (m_use_mouse.Value == 0) {
        return false;
      }
      M_StartControlPanel(true);
      menu = &local_30;
    }
    else {
      if (ev->type != '\x01') {
        return false;
      }
      if (ev->data1 != 1) {
        if (ev->data1 != 0x3b) {
          return false;
        }
        if (devparm) {
          G_ScreenShot((char *)0x0);
          return true;
        }
        return false;
      }
      M_StartControlPanel(true);
      menu = &local_2c;
    }
    menu->Index = 0x1d5;
    M_SetMenu(menu,-1);
    return true;
  }
  BVar1 = ev->type;
  if (BVar1 == '\x04') {
    BVar2 = ev->subtype;
    uVar8 = 7;
    iVar7 = 7;
    if (BVar2 == '\x01') {
LAB_00355802:
      iVar5 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[0xc])();
      if ((char)iVar5 == '\0') goto LAB_003558a2;
      sVar3 = ev->data1;
      BVar2 = ev->subtype;
      switch(sVar3) {
      case 1:
        iVar5 = 1;
        if (BVar2 != '\x03') goto LAB_0035583e;
LAB_00355950:
        iVar7 = 5;
        goto LAB_003559c7;
      case 2:
        iVar5 = 2;
        if (BVar2 == '\x03') goto LAB_0035595a;
        goto LAB_003559b2;
      case 3:
      case 4:
      case 7:
      case 9:
      case 0xc:
switchD_00355831_caseD_3:
        bVar9 = true;
        if (BVar2 != '\x03') {
LAB_003557a1:
          iVar5 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[7])(DMenu::CurrentMenu,ev);
          return SUB41(iVar5,0);
        }
switchD_0035570c_caseD_1a0:
        iVar5 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[7])(DMenu::CurrentMenu,ev);
        return (bool)(bVar9 ^ 1U | (byte)iVar5);
      case 5:
        iVar5 = 5;
        if (BVar2 != '\x03') goto LAB_003559ea;
LAB_003558f4:
        iVar7 = 2;
        goto LAB_003559c7;
      case 6:
        iVar5 = 6;
        if (BVar2 != '\x03') goto LAB_003559fb;
LAB_00355905:
        iVar7 = 3;
        goto LAB_003559c7;
      case 8:
        iVar5 = 8;
        if (BVar2 != '\x03') {
          bVar9 = false;
          uVar8 = 8;
          goto LAB_00355a01;
        }
        goto LAB_003559c3;
      case 10:
        goto switchD_00355831_caseD_a;
      case 0xb:
        bVar9 = true;
        uVar8 = 0;
        iVar5 = 0xb;
        if (BVar2 != '\x03') goto LAB_00355a01;
        goto LAB_003558e2;
      case 0xd:
        iVar5 = 0xd;
        if (BVar2 != '\x03') goto LAB_003559a3;
LAB_0035586c:
        iVar7 = 6;
        goto LAB_003559c7;
      default:
        if (sVar3 == 0x1e) {
          iVar5 = 0x1e;
        }
        else {
          if (sVar3 != 0x1b) goto switchD_00355831_caseD_3;
          iVar5 = 0x1b;
        }
        iVar4 = iVar5;
        if (BVar2 == '\x03') goto LAB_003559c7;
        goto LAB_003559a7;
      }
    }
    if (BVar2 == '\x02') {
      return true;
    }
    if (BVar2 == '\x03') goto LAB_00355802;
    iVar5 = 0;
    iVar4 = 0;
    if (BVar2 != '\x14') {
      if (BVar2 != '\x15') {
        if (((byte)(BVar2 - 5) < 0x14) && (m_use_mouse.Value == 0)) {
          return true;
        }
        goto LAB_003557a1;
      }
      goto LAB_003559c7;
    }
LAB_003559a7:
    iVar5 = iVar4;
    bVar9 = false;
    goto LAB_00355a01;
  }
  if (1 < (byte)(BVar1 - 1) || menuactive == MENU_WaitKey) {
LAB_003558a2:
    bVar9 = false;
    goto switchD_0035570c_caseD_1a0;
  }
  bVar9 = BVar1 == '\x02';
  sVar3 = ev->data1;
  iVar5 = (int)sVar3;
  iVar4 = iVar5;
  switch(sVar3) {
  case 0x19c:
  case 0x1ae:
  case 0x1b5:
switchD_0035570c_caseD_19c:
    if (BVar1 == '\x02') {
LAB_00355912:
      iVar7 = 1;
LAB_003559c7:
      FButtonStatus::ReleaseKey
                ((FButtonStatus *)((long)MenuButtons[0].Keys + (ulong)(uint)(iVar7 << 4)),iVar5);
      return false;
    }
LAB_00355980:
    uVar8 = 1;
    break;
  case 0x19d:
  case 0x1af:
  case 0x1b4:
switchD_0035570c_caseD_19d:
    bVar9 = true;
    uVar8 = 0;
    if (BVar1 != '\x02') goto LAB_00355a01;
LAB_003558e2:
    iVar7 = 0;
    goto LAB_003559c7;
  case 0x19e:
  case 0x1ac:
  case 0x1b7:
switchD_0035570c_caseD_19e:
    if (BVar1 == '\x02') goto LAB_00355905;
LAB_003559fb:
    uVar8 = 3;
    break;
  case 0x19f:
  case 0x1ad:
  case 0x1b6:
switchD_0035570c_caseD_19f:
    if (BVar1 == '\x02') goto LAB_003558f4;
LAB_003559ea:
    uVar8 = 2;
    break;
  case 0x1a0:
  case 0x1a1:
  case 0x1a2:
  case 0x1a3:
  case 0x1a4:
  case 0x1a5:
  case 0x1a6:
  case 0x1a7:
  case 0x1a8:
  case 0x1a9:
  case 0x1aa:
  case 0x1ab:
  case 0x1b0:
  case 0x1b1:
  case 0x1b2:
  case 0x1b3:
  case 0x1b8:
  case 0x1b9:
  case 0x1ba:
  case 0x1bb:
  case 0x1be:
  case 0x1bf:
    goto switchD_0035570c_caseD_1a0;
  case 0x1bc:
switchD_0035570c_caseD_1bc:
    if (BVar1 == '\x02') {
LAB_0035595a:
      iVar7 = 4;
      goto LAB_003559c7;
    }
LAB_003559b2:
    uVar8 = 4;
    break;
  case 0x1bd:
switchD_0035570c_caseD_1bd:
    if (BVar1 == '\x02') goto LAB_00355950;
LAB_0035583e:
    uVar8 = 5;
    break;
  case 0x1c0:
switchD_0035570c_caseD_1c0:
    if (BVar1 == '\x02') goto LAB_0035586c;
LAB_003559a3:
    uVar8 = 6;
    iVar4 = iVar5;
    goto LAB_003559a7;
  case 0x1c1:
switchD_0035570c_caseD_1c1:
    if (BVar1 == '\x02') {
      iVar7 = 7;
      goto LAB_003559c7;
    }
    uVar8 = 7;
    goto LAB_003559a7;
  case 0x1c2:
switchD_0035570c_caseD_1c2:
    if (BVar1 != '\x02') {
      uVar8 = 8;
      goto LAB_003559a7;
    }
LAB_003559c3:
    iVar7 = 8;
    goto LAB_003559c7;
  default:
    switch(sVar3) {
    case 0x108:
      goto switchD_0035570c_caseD_1c0;
    case 0x109:
      goto switchD_0035570c_caseD_1c1;
    case 0x10a:
      goto switchD_0035570c_caseD_1c2;
    case 0x10b:
      goto switchD_0035570c_caseD_1a0;
    case 0x10c:
      goto switchD_0035570c_caseD_1bc;
    case 0x10d:
      goto switchD_0035570c_caseD_1bd;
    default:
      switch(sVar3) {
      case 0x188:
        goto switchD_0035570c_caseD_19d;
      case 0x189:
        goto switchD_0035570c_caseD_19e;
      case 0x18a:
        goto switchD_0035570c_caseD_19c;
      case 0x18b:
        goto switchD_0035570c_caseD_19f;
      default:
        goto switchD_0035570c_caseD_1a0;
      }
    }
  }
  bVar9 = true;
LAB_00355a01:
  FButtonStatus::PressKey((FButtonStatus *)((long)MenuButtons[0].Keys + (ulong)(uVar8 << 4)),iVar5);
  uVar6 = (ulong)uVar8;
  MenuButtonOrigin[uVar6] = BVar1 != '\x04';
  if (bVar9) {
    MenuButtonTickers[uVar6] = 0xe;
  }
  (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[8])
            (DMenu::CurrentMenu,uVar6,(ulong)(BVar1 != '\x04'));
  return true;
switchD_00355831_caseD_a:
  iVar5 = 10;
  if (BVar2 != '\x03') goto LAB_00355980;
  goto LAB_00355912;
}

Assistant:

bool M_Responder (event_t *ev) 
{ 
	int ch = 0;
	bool keyup = false;
	int mkey = NUM_MKEYS;
	bool fromcontroller = true;

	if (chatmodeon)
	{
		return false;
	}

	if (DMenu::CurrentMenu != NULL && menuactive != MENU_Off) 
	{
		// There are a few input sources we are interested in:
		//
		// EV_KeyDown / EV_KeyUp : joysticks/gamepads/controllers
		// EV_GUI_KeyDown / EV_GUI_KeyUp : the keyboard
		// EV_GUI_Char : printable characters, which we want in string input mode
		//
		// This code previously listened for EV_GUI_KeyRepeat to handle repeating
		// in the menus, but that doesn't work with gamepads, so now we combine
		// the multiple inputs into buttons and handle the repetition manually.
		if (ev->type == EV_GUI_Event)
		{
			fromcontroller = false;
			if (ev->subtype == EV_GUI_KeyRepeat)
			{
				// We do our own key repeat handling but still want to eat the
				// OS's repeated keys.
				return true;
			}
			else if (ev->subtype == EV_GUI_BackButtonDown || ev->subtype == EV_GUI_BackButtonUp)
			{
				mkey = MKEY_Back;
				keyup = ev->subtype == EV_GUI_BackButtonUp;
			}
			else if (ev->subtype != EV_GUI_KeyDown && ev->subtype != EV_GUI_KeyUp)
			{
				// do we want mouse input?
				if (ev->subtype >= EV_GUI_FirstMouseEvent && ev->subtype <= EV_GUI_LastMouseEvent)
				{
						if (!m_use_mouse)
							return true;
				}

				// pass everything else on to the current menu
				return DMenu::CurrentMenu->Responder(ev);
			}
			else if (DMenu::CurrentMenu->TranslateKeyboardEvents())
			{
				ch = ev->data1;
				keyup = ev->subtype == EV_GUI_KeyUp;
				switch (ch)
				{
				case GK_BACK:			mkey = MKEY_Back;		break;
				case GK_ESCAPE:			mkey = MKEY_Back;		break;
				case GK_RETURN:			mkey = MKEY_Enter;		break;
				case GK_UP:				mkey = MKEY_Up;			break;
				case GK_DOWN:			mkey = MKEY_Down;		break;
				case GK_LEFT:			mkey = MKEY_Left;		break;
				case GK_RIGHT:			mkey = MKEY_Right;		break;
				case GK_BACKSPACE:		mkey = MKEY_Clear;		break;
				case GK_PGUP:			mkey = MKEY_PageUp;		break;
				case GK_PGDN:			mkey = MKEY_PageDown;	break;
				default:
					if (!keyup)
					{
						return DMenu::CurrentMenu->Responder(ev);
					}
					break;
				}
			}
		}
		else if (menuactive != MENU_WaitKey && (ev->type == EV_KeyDown || ev->type == EV_KeyUp))
		{
			keyup = ev->type == EV_KeyUp;

			ch = ev->data1;
			switch (ch)
			{
			case KEY_JOY1:
			case KEY_PAD_A:
				mkey = MKEY_Enter;
				break;

			case KEY_JOY2:
			case KEY_PAD_B:
				mkey = MKEY_Back;
				break;

			case KEY_JOY3:
			case KEY_PAD_X:
				mkey = MKEY_Clear;
				break;

			case KEY_JOY5:
			case KEY_PAD_LSHOULDER:
				mkey = MKEY_PageUp;
				break;

			case KEY_JOY6:
			case KEY_PAD_RSHOULDER:
				mkey = MKEY_PageDown;
				break;

			case KEY_PAD_DPAD_UP:
			case KEY_PAD_LTHUMB_UP:
			case KEY_JOYAXIS1MINUS:
			case KEY_JOYPOV1_UP:
				mkey = MKEY_Up;
				break;

			case KEY_PAD_DPAD_DOWN:
			case KEY_PAD_LTHUMB_DOWN:
			case KEY_JOYAXIS1PLUS:
			case KEY_JOYPOV1_DOWN:
				mkey = MKEY_Down;
				break;

			case KEY_PAD_DPAD_LEFT:
			case KEY_PAD_LTHUMB_LEFT:
			case KEY_JOYAXIS2MINUS:
			case KEY_JOYPOV1_LEFT:
				mkey = MKEY_Left;
				break;

			case KEY_PAD_DPAD_RIGHT:
			case KEY_PAD_LTHUMB_RIGHT:
			case KEY_JOYAXIS2PLUS:
			case KEY_JOYPOV1_RIGHT:
				mkey = MKEY_Right;
				break;
			}
		}

		if (mkey != NUM_MKEYS)
		{
			if (keyup)
			{
				MenuButtons[mkey].ReleaseKey(ch);
				return false;
			}
			else
			{
				MenuButtons[mkey].PressKey(ch);
				MenuButtonOrigin[mkey] = fromcontroller;
				if (mkey <= MKEY_PageDown)
				{
					MenuButtonTickers[mkey] = KEY_REPEAT_DELAY;
				}
				DMenu::CurrentMenu->MenuEvent(mkey, fromcontroller);
				return true;
			}
		}
		return DMenu::CurrentMenu->Responder(ev) || !keyup;
	}
	else if (MenuEnabled)
	{
		if (ev->type == EV_KeyDown)
		{
			// Pop-up menu?
			if (ev->data1 == KEY_ESCAPE)
			{
				M_StartControlPanel(true);
				M_SetMenu(NAME_Mainmenu, -1);
				return true;
			}
			// If devparm is set, pressing F1 always takes a screenshot no matter
			// what it's bound to. (for those who don't bother to read the docs)
			if (devparm && ev->data1 == KEY_F1)
			{
				G_ScreenShot(NULL);
				return true;
			}
			return false;
		}
		else if (ev->type == EV_GUI_Event && ev->subtype == EV_GUI_LButtonDown && 
				 ConsoleState != c_down && m_use_mouse)
		{
			M_StartControlPanel(true);
			M_SetMenu(NAME_Mainmenu, -1);
			return true;
		}
	}
	return false;
}